

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O3

int X509_NAME_get_text_by_OBJ(X509_NAME *name,ASN1_OBJECT *obj,char *buf,int len)

{
  int iVar1;
  uint uVar2;
  X509_NAME_ENTRY *pXVar3;
  uint uVar4;
  uint uVar5;
  ASN1_STRING *in;
  ulong len_00;
  uchar *text;
  CBS cbs;
  uchar *local_40;
  CBS local_38;
  
  uVar5 = 0xffffffff;
  iVar1 = X509_NAME_get_index_by_OBJ(name,obj,-1);
  if (-1 < iVar1) {
    pXVar3 = X509_NAME_get_entry(name,iVar1);
    if (pXVar3 == (X509_NAME_ENTRY *)0x0) {
      in = (ASN1_STRING *)0x0;
    }
    else {
      in = pXVar3->value;
    }
    local_40 = (uchar *)0x0;
    uVar2 = ASN1_STRING_to_UTF8(&local_40,in);
    uVar4 = 0xffffffff;
    uVar5 = uVar4;
    if (-1 < (int)uVar2) {
      len_00 = (ulong)uVar2;
      local_38.data = local_40;
      local_38.len = len_00;
      iVar1 = CBS_contains_zero_byte(&local_38);
      if ((((iVar1 == 0) && (uVar5 = uVar2, buf != (char *)0x0)) &&
          (uVar5 = uVar4, (int)uVar2 < len)) &&
         (iVar1 = CBS_copy_bytes(&local_38,(uint8_t *)buf,len_00), iVar1 != 0)) {
        buf[len_00] = '\0';
        uVar5 = uVar2;
      }
    }
    OPENSSL_free(local_40);
  }
  return uVar5;
}

Assistant:

int X509_NAME_get_text_by_OBJ(const X509_NAME *name, const ASN1_OBJECT *obj,
                              char *buf, int len) {
  int i = X509_NAME_get_index_by_OBJ(name, obj, -1);
  if (i < 0) {
    return -1;
  }
  const ASN1_STRING *data =
      X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));
  unsigned char *text = NULL;
  int ret = -1;
  int text_len = ASN1_STRING_to_UTF8(&text, data);
  // Fail if we could not encode as UTF-8.
  if (text_len < 0) {
    goto out;
  }
  CBS cbs;
  CBS_init(&cbs, text, text_len);
  // Fail if the UTF-8 encoding constains a 0 byte because this is
  // returned as a C string and callers very often do not check.
  if (CBS_contains_zero_byte(&cbs)) {
    goto out;
  }
  // We still support the "pass NULL to find out how much" API
  if (buf != NULL) {
    if (text_len >= len || len <= 0 ||
        !CBS_copy_bytes(&cbs, (uint8_t *)buf, text_len)) {
      goto out;
    }
    // It must be a C string
    buf[text_len] = '\0';
  }
  ret = text_len;

out:
  OPENSSL_free(text);
  return ret;
}